

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg.c
# Opt level: O0

keypress borg_inkey_hack(wchar_t flush_first)

{
  undefined4 extraout_EDX;
  keypress kVar1;
  undefined1 local_38;
  ui_event_type local_28;
  undefined1 auStack_18 [4];
  wchar_t flush_first_local;
  keypress k;
  
  kVar1 = internal_borg_inkey(flush_first);
  _auStack_18 = kVar1._0_8_;
  local_28 = CONCAT31(local_28._1_3_,kVar1.mods);
  k.type = local_28;
  save_keypress_history((keypress *)auStack_18);
  local_38 = (undefined1)k.type;
  kVar1._9_3_ = (undefined3)((uint)extraout_EDX >> 8);
  kVar1.mods = local_38;
  kVar1.type = (ui_event_type)auStack_18;
  kVar1.code = flush_first_local;
  return kVar1;
}

Assistant:

static struct keypress borg_inkey_hack(int flush_first)
{
    struct keypress k = internal_borg_inkey(flush_first);

    save_keypress_history(&k);

    return k;
}